

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int GetBackwardReferences
              (int width,int height,uint32_t *argb,int quality,int lz77_types_to_try,
              int cache_bits_max,int do_no_cache,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs,
              int *cache_bits_best)

{
  int iVar1;
  VP8LBackwardRefs *refs_dst;
  VP8LHistogram *pVVar2;
  int in_ECX;
  uint in_R8D;
  int in_R9D;
  int in_stack_00000008;
  VP8LHistogram *in_stack_00000010;
  long in_stack_00000018;
  int *in_stack_00000020;
  uint64_t bit_cost_trace;
  int cache_bits_1;
  VP8LHashChain *hash_chain_tmp;
  int cache_bits;
  uint64_t bit_cost;
  int res;
  int status;
  VP8LBackwardRefs *refs_tmp;
  VP8LHashChain hash_chain_box;
  uint64_t bit_costs_best [2];
  int lz77_types_best [2];
  int lz77_type;
  int i;
  VP8LHistogram *histo;
  VP8LHashChain *in_stack_000000e0;
  int in_stack_000000ec;
  uint32_t *in_stack_000000f0;
  undefined4 in_stack_000000f8;
  int in_stack_000000fc;
  int in_stack_00000100;
  int in_stack_00000104;
  uint32_t *in_stack_00000108;
  VP8LBackwardRefs *in_stack_00000110;
  VP8LBackwardRefs *in_stack_ffffffffffffff48;
  VP8LHistogram *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  VP8LHistogram *local_a0;
  int in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  VP8LBackwardRefs *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  VP8LHistogram *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint64_t in_stack_ffffffffffffff90;
  int iVar3;
  int iVar4;
  VP8LBackwardRefs *pVVar5;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  VP8LHashChain *hash_chain_00;
  undefined8 uVar6;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uint uVar7;
  uint uVar8;
  uint32_t in_stack_ffffffffffffffd4;
  uint local_18;
  
  memset(&stack0xffffffffffffffc8,0,8);
  hash_chain_00 = (VP8LHashChain *)0xffffffffffffffff;
  uVar6._0_4_ = 0xffffffff;
  uVar6._4_4_ = 0xffffffff;
  iVar4 = 1;
  if (in_stack_00000008 != 0) {
    iVar4 = 2;
  }
  refs_dst = (VP8LBackwardRefs *)(in_stack_00000018 + (long)iVar4 * 0x28);
  iVar4 = 0;
  memset(&stack0xffffffffffffffa8,0,0x10);
  pVVar2 = VP8LAllocateHistogram(in_stack_ffffffffffffff5c);
  if (pVVar2 != (VP8LHistogram *)0x0) {
    uVar7 = 1;
    for (local_18 = in_R8D; local_18 != 0; local_18 = (uVar8 ^ 0xffffffff) & local_18) {
      iVar3 = 0;
      in_stack_ffffffffffffff90 = 0;
      uVar8 = uVar7;
      if ((local_18 & uVar7) != 0) {
        if (uVar7 == 1) {
          iVar3 = BackwardReferencesLz77
                            (in_stack_ffffffffffffffd4,1,
                             (uint32_t *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             uVar6._4_4_,hash_chain_00,
                             (VP8LBackwardRefs *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        }
        else if (uVar7 == 2) {
          iVar3 = BackwardReferencesRle
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             (uint32_t *)refs_dst,iVar4,(VP8LBackwardRefs *)0x0);
        }
        else if (uVar7 == 4) {
          iVar3 = VP8LHashChainInit((VP8LHashChain *)in_stack_ffffffffffffff48,0);
          in_stack_ffffffffffffff48 = refs_dst;
          if (iVar3 == 0) goto LAB_001c220e;
          refs_dst = in_stack_ffffffffffffff48;
          iVar3 = BackwardReferencesLz77Box
                            (in_stack_00000100,in_stack_000000fc,in_stack_000000f0,in_stack_000000ec
                             ,in_stack_000000e0,(VP8LHashChain *)cache_bits_best,in_stack_00000110);
        }
        if (iVar3 == 0) goto LAB_001c220e;
        for (in_stack_ffffffffffffffd4 = 1; in_stack_ffffffffffffff6c = uVar7,
            -1 < (int)in_stack_ffffffffffffffd4;
            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 - 1) {
          in_stack_ffffffffffffff68 = in_R9D;
          if ((in_stack_ffffffffffffffd4 != 1) ||
             (in_stack_ffffffffffffff68 = 0, in_stack_ffffffffffffff8c = in_stack_ffffffffffffff68,
             in_stack_00000008 != 0)) {
            in_stack_ffffffffffffff8c = in_stack_ffffffffffffff68;
            if ((in_stack_ffffffffffffffd4 == 0) &&
               ((iVar1 = CalculateBestCacheSize
                                   (in_stack_00000108,in_stack_00000104,
                                    (VP8LBackwardRefs *)
                                    CONCAT44(in_stack_000000fc,in_stack_000000f8),
                                    (int *)in_stack_000000f0), iVar1 == 0 ||
                ((0 < in_stack_ffffffffffffff8c &&
                 (iVar1 = BackwardRefsWithLocalCache
                                    ((uint32_t *)
                                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                     (int)((ulong)refs_dst >> 0x20),
                                     (VP8LBackwardRefs *)CONCAT44(iVar4,iVar3)), iVar1 == 0))))))
            goto LAB_001c220e;
            if ((in_stack_ffffffffffffffd4 != 0) ||
               ((in_stack_00000008 == 0 || (in_stack_ffffffffffffff8c != 0)))) {
              VP8LHistogramCreate(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0);
              in_stack_ffffffffffffff90 = VP8LHistogramEstimateBits(in_stack_ffffffffffffff80);
            }
            if (in_stack_ffffffffffffff90 <
                *(ulong *)(&stack0xffffffffffffffb8 + (long)(int)in_stack_ffffffffffffffd4 * 8)) {
              if (in_stack_ffffffffffffffd4 == 1) {
                iVar1 = BackwardRefsClone((VP8LBackwardRefs *)
                                          CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58),
                                          (VP8LBackwardRefs *)in_stack_ffffffffffffff50);
                if (iVar1 == 0) goto LAB_001c220e;
              }
              else {
                BackwardRefsSwap((VP8LBackwardRefs *)in_stack_ffffffffffffff80,
                                 (VP8LBackwardRefs *)
                                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
              }
              *(uint64_t *)(&stack0xffffffffffffffb8 + (long)(int)in_stack_ffffffffffffffd4 * 8) =
                   in_stack_ffffffffffffff90;
              *(uint *)(&stack0xffffffffffffffc8 + (long)(int)in_stack_ffffffffffffffd4 * 4) = uVar8
              ;
              if (in_stack_ffffffffffffffd4 == 0) {
                *in_stack_00000020 = in_stack_ffffffffffffff8c;
              }
            }
          }
        }
      }
      uVar7 = uVar8 << 1;
    }
    for (uVar6._4_4_ = 1; -1 < (int)uVar6._4_4_; uVar6._4_4_ = uVar6._4_4_ - 1) {
      if ((uVar6._4_4_ != 1) || (in_stack_00000008 != 0)) {
        pVVar5 = refs_dst;
        if (((*(int *)(&stack0xffffffffffffffc8 + (long)(int)uVar6._4_4_ * 4) == 1) ||
            (*(int *)(&stack0xffffffffffffffc8 + (long)(int)uVar6._4_4_ * 4) == 4)) &&
           (0x18 < in_ECX)) {
          if (*(int *)(&stack0xffffffffffffffc8 + (long)(int)uVar6._4_4_ * 4) == 1) {
            local_a0 = in_stack_00000010;
          }
          else {
            local_a0 = (VP8LHistogram *)&stack0xffffffffffffffa8;
          }
          if (uVar6._4_4_ == 1) {
            in_stack_ffffffffffffff5c = 0;
          }
          else {
            in_stack_ffffffffffffff5c = *in_stack_00000020;
          }
          iVar3 = in_stack_ffffffffffffff5c;
          iVar1 = VP8LBackwardReferencesTraceBackwards
                            ((int)(in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90
                             ,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             (int)((ulong)local_a0 >> 0x20),
                             (VP8LHashChain *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff78),
                             in_stack_ffffffffffffff70,refs_dst);
          if (iVar1 == 0) goto LAB_001c220e;
          VP8LHistogramCreate(in_stack_ffffffffffffff50,refs_dst,0);
          in_stack_ffffffffffffff70 = (VP8LBackwardRefs *)VP8LHistogramEstimateBits(local_a0);
          if (in_stack_ffffffffffffff70 <
              *(VP8LBackwardRefs **)(&stack0xffffffffffffffb8 + (long)(int)uVar6._4_4_ * 8)) {
            BackwardRefsSwap((VP8LBackwardRefs *)local_a0,
                             (VP8LBackwardRefs *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
          }
        }
        BackwardReferences2DLocality
                  ((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (VP8LBackwardRefs *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                  );
        refs_dst = pVVar5;
        if (((uVar6._4_4_ == 1) && (in_stack_ffffffffffffffc8 == in_stack_ffffffffffffffcc)) &&
           (*in_stack_00000020 == 0)) {
          iVar3 = BackwardRefsClone((VP8LBackwardRefs *)
                                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                    (VP8LBackwardRefs *)in_stack_ffffffffffffff50);
          if (iVar3 == 0) goto LAB_001c220e;
          break;
        }
      }
    }
    iVar4 = 1;
  }
LAB_001c220e:
  VP8LHashChainClear((VP8LHashChain *)0x1c2218);
  VP8LFreeHistogram((VP8LHistogram *)0x1c2225);
  return iVar4;
}

Assistant:

static int GetBackwardReferences(int width, int height,
                                 const uint32_t* const argb, int quality,
                                 int lz77_types_to_try, int cache_bits_max,
                                 int do_no_cache,
                                 const VP8LHashChain* const hash_chain,
                                 VP8LBackwardRefs* const refs,
                                 int* const cache_bits_best) {
  VP8LHistogram* histo = NULL;
  int i, lz77_type;
  // Index 0 is for a color cache, index 1 for no cache (if needed).
  int lz77_types_best[2] = {0, 0};
  uint64_t bit_costs_best[2] = {WEBP_UINT64_MAX, WEBP_UINT64_MAX};
  VP8LHashChain hash_chain_box;
  VP8LBackwardRefs* const refs_tmp = &refs[do_no_cache ? 2 : 1];
  int status = 0;
  memset(&hash_chain_box, 0, sizeof(hash_chain_box));

  histo = VP8LAllocateHistogram(MAX_COLOR_CACHE_BITS);
  if (histo == NULL) goto Error;

  for (lz77_type = 1; lz77_types_to_try;
       lz77_types_to_try &= ~lz77_type, lz77_type <<= 1) {
    int res = 0;
    uint64_t bit_cost = 0u;
    if ((lz77_types_to_try & lz77_type) == 0) continue;
    switch (lz77_type) {
      case kLZ77RLE:
        res = BackwardReferencesRle(width, height, argb, 0, refs_tmp);
        break;
      case kLZ77Standard:
        // Compute LZ77 with no cache (0 bits), as the ideal LZ77 with a color
        // cache is not that different in practice.
        res = BackwardReferencesLz77(width, height, argb, 0, hash_chain,
                                     refs_tmp);
        break;
      case kLZ77Box:
        if (!VP8LHashChainInit(&hash_chain_box, width * height)) goto Error;
        res = BackwardReferencesLz77Box(width, height, argb, 0, hash_chain,
                                        &hash_chain_box, refs_tmp);
        break;
      default:
        assert(0);
    }
    if (!res) goto Error;

    // Start with the no color cache case.
    for (i = 1; i >= 0; --i) {
      int cache_bits = (i == 1) ? 0 : cache_bits_max;

      if (i == 1 && !do_no_cache) continue;

      if (i == 0) {
        // Try with a color cache.
        if (!CalculateBestCacheSize(argb, quality, refs_tmp, &cache_bits)) {
          goto Error;
        }
        if (cache_bits > 0) {
          if (!BackwardRefsWithLocalCache(argb, cache_bits, refs_tmp)) {
            goto Error;
          }
        }
      }

      if (i == 0 && do_no_cache && cache_bits == 0) {
        // No need to re-compute bit_cost as it was computed at i == 1.
      } else {
        VP8LHistogramCreate(histo, refs_tmp, cache_bits);
        bit_cost = VP8LHistogramEstimateBits(histo);
      }

      if (bit_cost < bit_costs_best[i]) {
        if (i == 1) {
          // Do not swap as the full cache analysis would have the wrong
          // VP8LBackwardRefs to start with.
          if (!BackwardRefsClone(refs_tmp, &refs[1])) goto Error;
        } else {
          BackwardRefsSwap(refs_tmp, &refs[0]);
        }
        bit_costs_best[i] = bit_cost;
        lz77_types_best[i] = lz77_type;
        if (i == 0) *cache_bits_best = cache_bits;
      }
    }
  }
  assert(lz77_types_best[0] > 0);
  assert(!do_no_cache || lz77_types_best[1] > 0);

  // Improve on simple LZ77 but only for high quality (TraceBackwards is
  // costly).
  for (i = 1; i >= 0; --i) {
    if (i == 1 && !do_no_cache) continue;
    if ((lz77_types_best[i] == kLZ77Standard ||
         lz77_types_best[i] == kLZ77Box) &&
        quality >= 25) {
      const VP8LHashChain* const hash_chain_tmp =
          (lz77_types_best[i] == kLZ77Standard) ? hash_chain : &hash_chain_box;
      const int cache_bits = (i == 1) ? 0 : *cache_bits_best;
      uint64_t bit_cost_trace;
      if (!VP8LBackwardReferencesTraceBackwards(width, height, argb, cache_bits,
                                                hash_chain_tmp, &refs[i],
                                                refs_tmp)) {
        goto Error;
      }
      VP8LHistogramCreate(histo, refs_tmp, cache_bits);
      bit_cost_trace = VP8LHistogramEstimateBits(histo);
      if (bit_cost_trace < bit_costs_best[i]) {
        BackwardRefsSwap(refs_tmp, &refs[i]);
      }
    }

    BackwardReferences2DLocality(width, &refs[i]);

    if (i == 1 && lz77_types_best[0] == lz77_types_best[1] &&
        *cache_bits_best == 0) {
      // If the best cache size is 0 and we have the same best LZ77, just copy
      // the data over and stop here.
      if (!BackwardRefsClone(&refs[1], &refs[0])) goto Error;
      break;
    }
  }
  status = 1;

 Error:
  VP8LHashChainClear(&hash_chain_box);
  VP8LFreeHistogram(histo);
  return status;
}